

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileAction.cpp
# Opt level: O2

void __thiscall QFileActionPrivate::triggered(QFileActionPrivate *this)

{
  Type TVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QArrayDataPointer<char16_t> *this_00;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_38;
  QString dir;
  
  dir.d.d = (this->directory).d.d;
  dir.d.ptr = (this->directory).d.ptr;
  dir.d.size = (this->directory).d.size;
  if (dir.d.d != (Data *)0x0) {
    LOCK();
    ((dir.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((dir.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a8.size = 0;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  if ((this->filePath).d.size != 0) {
    QString::operator=(&dir,(QString *)&this->filePath);
  }
  TVar1 = this->type;
  if (TVar1 == OpenFolder) {
    if ((this->options).super__Optional_base<QFlags<QFileDialog::Option>,_true,_true>._M_payload.
        super__Optional_payload_base<QFlags<QFileDialog::Option>_>._M_engaged == true) {
      QFileDialog::getExistingDirectory
                (&local_58,0,&this->caption,&dir,
                 (this->options).super__Optional_base<QFlags<QFileDialog::Option>,_true,_true>.
                 _M_payload.super__Optional_payload_base<QFlags<QFileDialog::Option>_>._M_payload);
    }
    else {
      QFileDialog::getExistingDirectory(&local_58,0,&this->caption,&dir,1);
    }
    qVar4 = local_a8.size;
    pcVar3 = local_a8.ptr;
    pDVar2 = local_a8.d;
    this_00 = &local_58;
    local_a8.d = local_58.d;
    local_a8.ptr = local_58.ptr;
    local_58.d = pDVar2;
    local_58.ptr = pcVar3;
    local_a8.size = local_58.size;
    local_58.size = qVar4;
  }
  else {
    if (TVar1 == SaveFile) {
      if ((this->options).super__Optional_base<QFlags<QFileDialog::Option>,_true,_true>._M_payload.
          super__Optional_payload_base<QFlags<QFileDialog::Option>_>._M_engaged == true) {
        local_38.d = (Data *)0x0;
        local_38.ptr = L";;";
        local_38.size = 2;
        local_88.d = (Data *)0x0;
        local_88.ptr = (char16_t *)0x0;
        local_88.size = 0;
        QListSpecialMethods<QString>::join
                  ((QString *)&local_70,(QListSpecialMethods<QString> *)&this->filter,
                   (QString *)&local_38);
        QFileDialog::getSaveFileName
                  (&local_58,0,&this->caption,&dir,&local_70,0,
                   (this->options).super__Optional_base<QFlags<QFileDialog::Option>,_true,_true>.
                   _M_payload.super__Optional_payload_base<QFlags<QFileDialog::Option>_>._M_payload)
        ;
      }
      else {
        local_38.d = (Data *)0x0;
        local_38.ptr = L";;";
        local_38.size = 2;
        local_88.d = (Data *)0x0;
        local_88.ptr = (char16_t *)0x0;
        local_88.size = 0;
        QListSpecialMethods<QString>::join
                  ((QString *)&local_70,(QListSpecialMethods<QString> *)&this->filter,
                   (QString *)&local_38);
        QFileDialog::getSaveFileName(&local_58,0,&this->caption,&dir,&local_70,0,0);
      }
    }
    else {
      if (TVar1 != OpenFile) goto LAB_0019b214;
      if ((this->options).super__Optional_base<QFlags<QFileDialog::Option>,_true,_true>._M_payload.
          super__Optional_payload_base<QFlags<QFileDialog::Option>_>._M_engaged == true) {
        local_38.d = (Data *)0x0;
        local_38.ptr = L";;";
        local_38.size = 2;
        local_88.d = (Data *)0x0;
        local_88.ptr = (char16_t *)0x0;
        local_88.size = 0;
        QListSpecialMethods<QString>::join
                  ((QString *)&local_70,(QListSpecialMethods<QString> *)&this->filter,
                   (QString *)&local_38);
        QFileDialog::getOpenFileName
                  (&local_58,0,&this->caption,&dir,&local_70,0,
                   (this->options).super__Optional_base<QFlags<QFileDialog::Option>,_true,_true>.
                   _M_payload.super__Optional_payload_base<QFlags<QFileDialog::Option>_>._M_payload)
        ;
      }
      else {
        local_38.d = (Data *)0x0;
        local_38.ptr = L";;";
        local_38.size = 2;
        local_88.d = (Data *)0x0;
        local_88.ptr = (char16_t *)0x0;
        local_88.size = 0;
        QListSpecialMethods<QString>::join
                  ((QString *)&local_70,(QListSpecialMethods<QString> *)&this->filter,
                   (QString *)&local_38);
        QFileDialog::getOpenFileName(&local_58,0,&this->caption,&dir,&local_70,0,0);
      }
    }
    qVar4 = local_a8.size;
    pcVar3 = local_a8.ptr;
    pDVar2 = local_a8.d;
    local_a8.d = local_58.d;
    local_a8.ptr = local_58.ptr;
    local_58.d = pDVar2;
    local_58.ptr = pcVar3;
    local_a8.size = local_58.size;
    local_58.size = qVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    this_00 = &local_88;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
LAB_0019b214:
  if (local_a8.ptr != (char16_t *)0x0) {
    QFileAction::setFilePath(this->action,(QString *)&local_a8);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&dir.d);
  return;
}

Assistant:

void triggered() {
        QString dir = directory;
        QString fn;

        if (!filePath.isEmpty()) {
            dir = filePath;
        }

        switch (type) {
        case QFileAction::Type::OpenFile:
            if (options) {
                fn = QFileDialog::getOpenFileName(nullptr, caption, dir, filter.join(QStringLiteral(";;")), nullptr,
                                                  *options);
            } else {
                fn = QFileDialog::getOpenFileName(nullptr, caption, dir, filter.join(QStringLiteral(";;")));
            }

            break;
        case QFileAction::Type::SaveFile:
            if (options) {
                fn = QFileDialog::getSaveFileName(nullptr, caption, dir, filter.join(QStringLiteral(";;")), nullptr,
                                                  *options);
            } else {
                fn = QFileDialog::getSaveFileName(nullptr, caption, dir, filter.join(QStringLiteral(";;")));
            }

            break;
        case QFileAction::Type::OpenFolder:
            if (options) {
                fn = QFileDialog::getExistingDirectory(nullptr, caption, dir, *options);
            } else {
                fn = QFileDialog::getExistingDirectory(nullptr, caption, dir);
            }

            break;
        }

        if (!fn.isNull()) {
            action->setFilePath(fn);
        }
    }